

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-app.h
# Opt level: O0

void __thiscall
mp::SolverApp<TestSolver,_TestNLReader>::Solve(SolverApp<TestSolver,_TestNLReader> *this)

{
  StringRef stub;
  pointer pSVar1;
  TestSolver *s;
  type options_00;
  CCallbacks *pCVar2;
  Result this_00;
  SolverApp<TestSolver,_TestNLReader> *in_RDI;
  AMPLS_ModelTraits mt;
  AppSolutionHandler<TestSolver> sol_handler;
  ArrayRef<long> options;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  StrictMockProblemBuilder *in_stack_fffffffffffffe40;
  long *in_stack_fffffffffffffe48;
  ProblemBuilder *pb;
  ArrayRef<long> *in_stack_fffffffffffffe50;
  ArrayRef<long> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  StrictMockProblemBuilder *b;
  char *in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffee0;
  
  b = (StrictMockProblemBuilder *)&in_RDI->handler_;
  pSVar1 = std::
           unique_ptr<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
           ::operator->((unique_ptr<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
                         *)0x235330);
  s = (TestSolver *)
      internal::
      SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>
      ::options(pSVar1);
  pSVar1 = std::
           unique_ptr<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
           ::operator->((unique_ptr<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
                         *)0x23534a);
  internal::
  SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>
  ::num_options(pSVar1);
  ArrayRef<long>::ArrayRef
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_fffffffffffffe40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  options_00 = std::
               unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
               ::operator*((unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
                            *)in_stack_fffffffffffffe40);
  ArrayRef<long>::ArrayRef
            ((ArrayRef<long> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  stub.size_ = in_stack_fffffffffffffed0;
  stub.data_ = in_stack_fffffffffffffec8;
  internal::AppSolutionHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::
  AppSolutionHandlerImpl
            ((AppSolutionHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter> *)
             in_RDI,stub,s,b,(ArrayRef<long> *)options_00,in_stack_fffffffffffffee0);
  ArrayRef<long>::~ArrayRef((ArrayRef<long> *)0x235431);
  pCVar2 = GetCallbacks(in_RDI);
  if (pCVar2->check != (Checker_AMPLS_ModeltTraits)0x0) {
    std::unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>::
    operator->((unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
                *)0x235469);
    StrictMockProblemBuilder::problem(in_stack_fffffffffffffe40);
    MockProblemBuilder::num_vars((MockProblemBuilder *)in_stack_fffffffffffffe40);
    std::unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>::
    operator->((unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
                *)0x2354ae);
    StrictMockProblemBuilder::problem(in_stack_fffffffffffffe40);
    MockProblemBuilder::num_algebraic_cons((MockProblemBuilder *)in_stack_fffffffffffffe40);
    std::unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>::
    operator->((unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
                *)0x2354f3);
    StrictMockProblemBuilder::problem(in_stack_fffffffffffffe40);
    MockProblemBuilder::num_logical_cons((MockProblemBuilder *)in_stack_fffffffffffffe40);
    pCVar2 = GetCallbacks(in_RDI);
    (*pCVar2->check)((AMPLS_ModelTraits *)&stack0xfffffffffffffec8);
  }
  pb = (ProblemBuilder *)&in_RDI->solver_;
  std::unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>::
  operator->((unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_> *
             )0x2355e9);
  this_00 = StrictMockProblemBuilder::problem(in_stack_fffffffffffffe40);
  TestSolver::Solve((TestSolver *)this_00,pb,(SolutionHandler *)in_stack_fffffffffffffe40);
  internal::AppSolutionHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::
  ~AppSolutionHandlerImpl
            ((AppSolutionHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter> *)
             0x23561e);
  ArrayRef<long>::~ArrayRef((ArrayRef<long> *)0x23562b);
  return;
}

Assistant:

void SolverApp<Solver, Reader>::Solve() {
  ArrayRef<long> options(handler_->options(), handler_->num_options());
  internal::AppSolutionHandler<Solver> sol_handler(
    filename_no_ext, solver_, *builder_, options,
    output_handler_.has_output ? 0 : banner_size);

  if (GetCallbacks().check)
  {
    AMPLS_ModelTraits mt;
    mt.n_vars = builder_->problem().num_vars();
    mt.n_alg_con = builder_->problem().num_algebraic_cons();
    mt.n_log_con = builder_->problem().num_logical_cons();
    mt.n_conic_con = 0;
    mt.n_quad_con = 0;
    GetCallbacks().check(&mt);
  }
  solver_.Solve(builder_->problem(), sol_handler);
}